

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<xe::TestCaseResultData>::SharedPtr
          (SharedPtr<xe::TestCaseResultData> *this,TestCaseResultData *ptr)

{
  TestCaseResultData *pTVar1;
  SharedPtrState<xe::TestCaseResultData,_de::DefaultDeleter<xe::TestCaseResultData>_> *pSVar2;
  DefaultDeleter<xe::TestCaseResultData> local_25 [13];
  TestCaseResultData *local_18;
  TestCaseResultData *ptr_local;
  SharedPtr<xe::TestCaseResultData> *this_local;
  
  this->m_ptr = (TestCaseResultData *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (TestCaseResultData *)this;
  pSVar2 = (SharedPtrState<xe::TestCaseResultData,_de::DefaultDeleter<xe::TestCaseResultData>_> *)
           operator_new(0x20);
  pTVar1 = local_18;
  DefaultDeleter<xe::TestCaseResultData>::DefaultDeleter(local_25);
  SharedPtrState<xe::TestCaseResultData,_de::DefaultDeleter<xe::TestCaseResultData>_>::
  SharedPtrState(pSVar2,pTVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}